

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-obj.c
# Opt level: O3

void do_cmd_use(command *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  char *fmt;
  object *obj;
  object *local_18;
  
  _Var1 = player_get_resume_normal_shape(player,cmd);
  if (!_Var1) {
    cmd_set_repeat(L'\0');
    return;
  }
  wVar2 = cmd_get_item((command_conflict *)cmd,"item",&local_18,"Use which item? ",
                       "You have no items to use.",obj_is_useable,L'ɏ');
  if (wVar2 == L'\0') {
    _Var1 = tval_is_ammo(local_18);
    if (_Var1) {
      do_cmd_fire(cmd);
    }
    else {
      _Var1 = tval_is_potion(local_18);
      if (_Var1) {
        do_cmd_quaff_potion(cmd);
      }
      else {
        _Var1 = tval_is_edible(local_18);
        if (_Var1) {
          do_cmd_eat_food(cmd);
        }
        else {
          _Var1 = tval_is_rod(local_18);
          if (_Var1) {
            do_cmd_zap_rod(cmd);
            return;
          }
          _Var1 = tval_is_wand(local_18);
          if (_Var1) {
            do_cmd_aim_wand(cmd);
            return;
          }
          _Var1 = tval_is_staff(local_18);
          if (_Var1) {
            do_cmd_use_staff(cmd);
            return;
          }
          _Var1 = tval_is_scroll(local_18);
          if (_Var1) {
            do_cmd_read_scroll(cmd);
          }
          else {
            _Var1 = obj_can_refill(local_18);
            if (_Var1) {
              do_cmd_refill(cmd);
            }
            else {
              _Var1 = obj_is_activatable(local_18);
              if (_Var1) {
                _Var1 = object_is_equipped(player->body,local_18);
                if (_Var1) {
                  do_cmd_activate(cmd);
                  return;
                }
                fmt = "Equip the item to use it.";
              }
              else {
                fmt = "The item cannot be used at the moment";
              }
              msg(fmt);
            }
          }
        }
      }
    }
  }
  cmd_set_repeat(L'\0');
  return;
}

Assistant:

void do_cmd_use(struct command *cmd)
{
	struct object *obj;

	if (!player_get_resume_normal_shape(player, cmd)) {
		cmd_set_repeat(0);
		return;
	}

	/* Get an item */
	if (cmd_get_item(cmd, "item", &obj,
			"Use which item? ",
			"You have no items to use.",
			obj_is_useable,
			USE_EQUIP | USE_INVEN | USE_QUIVER | USE_FLOOR | SHOW_FAIL | QUIVER_TAGS | SHOW_FAIL) != CMD_OK) {
		cmd_set_repeat(0);
		return;
	}

	/*
	 * If this is not a staff, wand, rod, or activatable item, always
	 * disable autorepetition.  The functions for handling a staff, wand
	 * rod, or activatable item take care of autorepetition for those
	 * objects.
	 */
	if (tval_is_ammo(obj)) {
		do_cmd_fire(cmd);
		cmd_set_repeat(0);
	} else if (tval_is_potion(obj)) {
		do_cmd_quaff_potion(cmd);
		cmd_set_repeat(0);
	} else if (tval_is_edible(obj)) {
		do_cmd_eat_food(cmd);
		cmd_set_repeat(0);
	} else if (tval_is_rod(obj)) {
		do_cmd_zap_rod(cmd);
	} else if (tval_is_wand(obj)) {
		do_cmd_aim_wand(cmd);
	} else if (tval_is_staff(obj)) {
		do_cmd_use_staff(cmd);
	} else if (tval_is_scroll(obj)) {
		do_cmd_read_scroll(cmd);
		cmd_set_repeat(0);
	} else if (obj_can_refill(obj)) {
		do_cmd_refill(cmd);
		cmd_set_repeat(0);
	} else if (obj_is_activatable(obj)) {
		if (object_is_equipped(player->body, obj)) {
			do_cmd_activate(cmd);
		} else {
			msg("Equip the item to use it.");
			cmd_set_repeat(0);
		}
	} else {
		msg("The item cannot be used at the moment");
		cmd_set_repeat(0);
	}
}